

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O2

bool mdns::query(int fd,sockaddr_in *address)

{
  bool bVar1;
  uint __i;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  long lVar5;
  int *piVar6;
  ssize_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  socklen_t addressSize;
  int local_194;
  sockaddr_in *local_190;
  long local_188;
  string packet;
  string name;
  timeval local_140;
  fd_set fds;
  sockaddr_storage addressStorage;
  
  packet._M_dataplus._M_p = (pointer)&packet.field_2;
  local_190 = address;
  std::__cxx11::string::_M_construct((ulong)&packet,'\0');
  addressSize = 0x80;
  tVar4 = time((time_t *)0x0);
  lVar10 = tVar4 + 10;
  local_188 = (long)(fd / 0x40);
  uVar11 = 1L << ((byte)fd & 0x3f);
  local_194 = fd + 1;
  iVar13 = 0;
  do {
    tVar4 = time((time_t *)0x0);
    if (lVar10 < tVar4) {
      if (s_verbose == true) {
        puts("\x1b[2K\r - Timeout waiting for mdns response, sending a new");
      }
      sendRequest(fd);
      tVar4 = time((time_t *)0x0);
      lVar10 = tVar4 + 10;
      iVar13 = iVar13 + 1;
    }
    else {
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        fds.fds_bits[lVar5] = 0;
      }
      fds.fds_bits[local_188] = fds.fds_bits[local_188] | uVar11;
      fds.fds_bits[0]._0_1_ = (byte)fds.fds_bits[0] | 1;
      local_140.tv_usec = 0;
      local_140.tv_sec = 1;
      iVar2 = select(local_194,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,&local_140);
      piVar6 = __errno_location();
      if (*piVar6 != 4) {
        if (iVar2 == 0) {
          uVar3 = (byte)(query::spinnerPos + 1) & 7;
          query::spinnerPos = (uint8_t)uVar3;
          printf("%c Waiting for response",(ulong)(uint)(int)"-\\|/-\\|/"[uVar3]);
          uVar12 = (long)iVar13 % 10 & 0xffffffff;
          if ((int)((long)iVar13 % 10) < 1) {
            uVar12 = 0;
          }
          while (iVar2 = (int)uVar12, uVar12 = (ulong)(iVar2 - 1), iVar2 != 0) {
            putchar(0x2e);
          }
          fflush(_stdout);
          printf("\x1b[2K\r");
        }
        else if (iVar2 < 0) {
          perror(" ! Error while waiting to read");
        }
        else {
          if (((byte)fds.fds_bits[0] & 1) != 0) {
            uVar3 = getchar();
            if ((uVar3 == 0x1b) || (uVar3 == 0x71)) {
              puts("Aborted");
              goto LAB_00106c86;
            }
            if (s_verbose == true) {
              printf("Unhandled key 0x%x\n",(ulong)uVar3);
            }
          }
          if ((fds.fds_bits[local_188] & uVar11) != 0) {
            sVar7 = recvfrom(fd,packet._M_dataplus._M_p,packet._M_string_length,0,
                             (sockaddr *)&addressStorage,&addressSize);
            if (sVar7 < 0) {
              perror(" ! Failed to read packet");
              goto LAB_00106c86;
            }
            if (addressStorage.ss_family == 2) {
              memcpy(local_190,&addressStorage,(ulong)addressSize);
              if (s_verbose == true) {
                puts(" < Got response");
              }
              std::__cxx11::string::resize((ulong)&packet);
              parsePacket(&name,&packet);
              if (name._M_string_length != 0) {
                bVar1 = std::operator!=(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)queryName_abi_cxx11_);
                if (!bVar1) {
                  std::__cxx11::string::~string((string *)&name);
                  bVar1 = true;
                  goto LAB_00106c88;
                }
                if (s_verbose == true) {
                  poVar8 = std::operator<<((ostream *)&std::cerr," - Got wrong name \'");
                  poVar8 = std::operator<<(poVar8,(string *)&name);
                  poVar8 = std::operator<<(poVar8,"\' from ");
                  pcVar9 = inet_ntoa((in_addr)(local_190->sin_addr).s_addr);
                  poVar8 = std::operator<<(poVar8,pcVar9);
                  std::endl<char,std::char_traits<char>>(poVar8);
                }
              }
              std::__cxx11::string::~string((string *)&name);
            }
            else {
              poVar8 = std::operator<<((ostream *)&std::cerr," ! Got wrong family, not IPv4 ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,addressStorage.ss_family);
              std::endl<char,std::char_traits<char>>(poVar8);
            }
          }
        }
      }
    }
    if (s_running == '\x01') {
LAB_00106c86:
      bVar1 = false;
LAB_00106c88:
      std::__cxx11::string::~string((string *)&packet);
      return bVar1;
    }
  } while( true );
}

Assistant:

bool query(const int fd, sockaddr_in *address)
{
    // TODO: continously loop and update when new devices appear

    std::string packet(512, '\0');

    sockaddr_storage addressStorage;
    socklen_t addressSize = sizeof(addressStorage);

    time_t endTime = time(nullptr) + 10;
    int pingTries = 0;

    do {
        if (time(nullptr) > endTime) {
            if (s_verbose) printf("\033[2K\r - Timeout waiting for mdns response, sending a new\n");
            sendRequest(fd);
            endTime = time(nullptr) + 10;
            pingTries++;
            continue;
        }

        fd_set fds;
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
        FD_SET(STDIN_FILENO, &fds);

        timeval tv = {0, 0};
        //tv.tv_usec = 100000; // 100ms, need dat nice spinner
        tv.tv_sec = 1;

        int st = select(fd+1, &fds, nullptr, nullptr, &tv);
        if (errno == EINTR) {
            continue;
        }
        if (st == 0) {
            static const char spinner[] = { '-', '\\', '|', '/', '-', '\\', '|', '/', };
            static uint8_t spinnerPos = 0;
            spinnerPos = (spinnerPos + 1) % sizeof(spinner);
            printf("%c Waiting for response", spinner[spinnerPos]);
            for (int i=0; i<pingTries % 10; i++) printf(".");
            fflush(stdout);
            printf("\033[2K\r"); // Erase the line, which won't be visible until the next flush
            continue;
        }
        if (st < 0) {
            if (errno != EINTR) {
                perror(" ! Error while waiting to read");
            }
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fds)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                puts("Aborted");
                return false;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }
        if (!FD_ISSET(fd, &fds)) {
            continue;
        }

        long size = recvfrom(
                fd,
                packet.data(),
                packet.size(),
                0,
                reinterpret_cast<sockaddr*>(&addressStorage),
                &addressSize
            );

        if (size < 0) {
            perror(" ! Failed to read packet");
            return false;
        }

        if (addressStorage.ss_family != AF_INET) {
            std::cerr << " ! Got wrong family, not IPv4 " << addressStorage.ss_family << std::endl;
            continue;
        }

        memcpy(address, &addressStorage, addressSize);
        if (s_verbose) {
            puts(" < Got response");
        }

        packet.resize(size);

        std::string name = parsePacket(packet);
        if (name.empty()) {
            continue;
        }
        if (name != queryName) {
            if (s_verbose) {
                std::cerr << " - Got wrong name '" << name << "' from " << inet_ntoa(address->sin_addr) << std::endl;
            }
            continue;
        }

        return true;
    } while (s_running);

    return false;
}